

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_entries.cpp
# Opt level: O0

void __thiscall ot::commissioner::persistent_storage::Network::Network(Network *this)

{
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  DomainId local_18;
  NetworkId local_14;
  Network *local_10;
  Network *this_local;
  
  local_10 = this;
  NetworkId::NetworkId(&local_14,0xffffffff);
  DomainId::DomainId(&local_18,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  Network(this,&local_14,&local_18,&local_38,0,0,0,&local_70,-1);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

Network::Network()
    : Network(EMPTY_ID, EMPTY_ID, "", 0, 0, 0, "", -1)
{
}